

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

bool __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::
parse_set_delimiter_tag
          (parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                 *contents,
          delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *delimiter_set)

{
  bool bVar1;
  long lVar2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> begin;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> contents_substr;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> end;
  
  if ((4 < contents->_M_string_length) &&
     ((contents->_M_dataplus)._M_p[contents->_M_string_length - 1] == L'=')) {
    std::__cxx11::wstring::substr((ulong)&begin,(ulong)contents);
    trim<std::__cxx11::wstring>(&contents_substr,(mustache *)&begin,s);
    std::__cxx11::wstring::~wstring((wstring *)&begin);
    bVar1 = false;
    lVar2 = std::__cxx11::wstring::find((wchar_t)&contents_substr,0x20);
    if (lVar2 != -1) {
      lVar2 = std::__cxx11::wstring::find_first_not_of((wchar_t)&contents_substr,0x20);
      if (lVar2 == -1) {
        __assert_fail("nonspace != string_type::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp"
                      ,0x33c,
                      "bool kainjow::mustache::parser<std::basic_string<wchar_t>>::parse_set_delimiter_tag(const string_type &, delimiter_set<string_type> &) const [string_type = std::basic_string<wchar_t>]"
                     );
      }
      std::__cxx11::wstring::substr((ulong)&begin,(ulong)&contents_substr);
      std::__cxx11::wstring::substr((ulong)&end,(ulong)&contents_substr);
      bVar1 = is_set_delimiter_valid(this,&begin);
      if ((bVar1) && (bVar1 = is_set_delimiter_valid(this,&end), bVar1)) {
        std::__cxx11::wstring::_M_assign((wstring *)delimiter_set);
        bVar1 = true;
        std::__cxx11::wstring::_M_assign((wstring *)&delimiter_set->end);
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::wstring::~wstring((wstring *)&end);
      std::__cxx11::wstring::~wstring((wstring *)&begin);
    }
    std::__cxx11::wstring::~wstring((wstring *)&contents_substr);
    return bVar1;
  }
  return false;
}

Assistant:

stream_type& render(basic_context<string_type>& ctx, stream_type& stream) {
        context_internal<string_type> context{ctx};
        render([&stream](const string_type& str) {
            stream << str;
        }, context);
        return stream;
    }